

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetInput.cpp
# Opt level: O0

void getCacheSize(void)

{
  ulong uVar1;
  
  puts("\nInput the number of the cache size(Unit:KB)");
  puts("\n\t(for example:1,2,4,8,16,32,64...2^18)");
  std::istream::operator>>((istream *)&std::cin,&i_cache_size);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) != 0) {
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::sync();
  }
  if (((i_cache_size == 0) || (0x3ffff < i_cache_size)) ||
     ((i_cache_size & (i_cache_size ^ 0xffffffffffffffff) + 1) != i_cache_size)) {
    getCacheSize();
  }
  return;
}

Assistant:

void getCacheSize()
{
	puts("\nInput the number of the cache size(Unit:KB)");
	puts("\n\t(for example:1,2,4,8,16,32,64...2^18)");
	cin >> i_cache_size;
	if (cin.fail())
	{
		cin.clear();
		cin.sync();
	}
	if (i_cache_size < 1 || i_cache_size >= 262144
			|| (i_cache_size & (~i_cache_size + 1)) != i_cache_size)
	{
		getCacheSize();
	}
}